

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::Dimension::ByteSizeLong(Dimension *this)

{
  DimensionCase DVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Dimension *this_local;
  
  sStack_18 = 0;
  DVar1 = dimension_case(this);
  if (DVar1 != DIMENSION_NOT_SET) {
    if (DVar1 == kConstant) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                            ((this->dimension_).constant_);
      sStack_18 = sStack_18 + 1;
    }
    else if (DVar1 == kUnknown) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                            ((this->dimension_).unknown_);
      sStack_18 = sStack_18 + 1;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t Dimension::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Dimension)
  size_t total_size = 0;

  switch (dimension_case()) {
    // .CoreML.Specification.MILSpec.Dimension.ConstantDimension constant = 1;
    case kConstant: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *dimension_.constant_);
      break;
    }
    // .CoreML.Specification.MILSpec.Dimension.UnknownDimension unknown = 2;
    case kUnknown: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *dimension_.unknown_);
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}